

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::operator[](Value *this,UInt index)

{
  ushort uVar1;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ushort uVar2;
  int iVar3;
  char *pcVar4;
  iterator __pos;
  bool bVar5;
  CZString key;
  value_type defaultValue;
  CZString local_60;
  ValueHolder local_50;
  ushort local_48;
  undefined2 uStack_46;
  Value local_40;
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
    uVar2 = (ushort)_local_48 & 0xfe00;
    local_48 = uVar2 + 6;
    pcVar4 = (char *)operator_new(0x30);
    pcVar4[0x10] = '\0';
    pcVar4[0x11] = '\0';
    pcVar4[0x12] = '\0';
    pcVar4[0x13] = '\0';
    pcVar4[0x14] = '\0';
    pcVar4[0x15] = '\0';
    pcVar4[0x16] = '\0';
    pcVar4[0x17] = '\0';
    pcVar4[0x18] = '\0';
    pcVar4[0x19] = '\0';
    pcVar4[0x1a] = '\0';
    pcVar4[0x1b] = '\0';
    pcVar4[0x1c] = '\0';
    pcVar4[0x1d] = '\0';
    pcVar4[0x1e] = '\0';
    pcVar4[0x1f] = '\0';
    pcVar4[0x20] = '\0';
    pcVar4[0x21] = '\0';
    pcVar4[0x22] = '\0';
    pcVar4[0x23] = '\0';
    pcVar4[0x24] = '\0';
    pcVar4[0x25] = '\0';
    pcVar4[0x26] = '\0';
    pcVar4[0x27] = '\0';
    pcVar4[0x28] = '\0';
    pcVar4[0x29] = '\0';
    pcVar4[0x2a] = '\0';
    pcVar4[0x2b] = '\0';
    pcVar4[0x2c] = '\0';
    pcVar4[0x2d] = '\0';
    pcVar4[0x2e] = '\0';
    pcVar4[0x2f] = '\0';
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\0';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    *(char **)(pcVar4 + 0x18) = pcVar4 + 8;
    *(char **)(pcVar4 + 0x20) = pcVar4 + 8;
    pcVar4[0x28] = '\0';
    pcVar4[0x29] = '\0';
    pcVar4[0x2a] = '\0';
    pcVar4[0x2b] = '\0';
    pcVar4[0x2c] = '\0';
    pcVar4[0x2d] = '\0';
    pcVar4[0x2e] = '\0';
    pcVar4[0x2f] = '\0';
    local_50 = this->value_;
    (this->value_).string_ = pcVar4;
    *(ushort *)&this->field_0x8 = uVar1 & 0xff00 | 6;
    *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 6;
    _local_48 = CONCAT22(uStack_46,uVar1 & 0x100 | uVar2);
    ~Value((Value *)&local_50);
  }
  else if ((char)uVar1 != '\x06') {
    __assert_fail("type_ == nullValue || type_ == arrayValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                  ,0x33f,"Value &Json::Value::operator[](UInt)");
  }
  local_60.cstr_ = (char *)0x0;
  this_00 = &((this->value_).map_)->_M_t;
  local_60.index_ = index;
  __pos = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::_M_lower_bound(this_00,(_Link_type)
                                   (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent,
                           &(this_00->_M_impl).super__Rb_tree_header._M_header,&local_60);
  if ((_Rb_tree_header *)__pos._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    if (*(char **)(__pos._M_node + 1) == (char *)0x0) {
      bVar5 = *(UInt *)&__pos._M_node[1]._M_parent == local_60.index_;
    }
    else {
      iVar3 = strcmp(*(char **)(__pos._M_node + 1),local_60.cstr_);
      bVar5 = iVar3 == 0;
    }
    if (bVar5) goto LAB_001c5195;
  }
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            ((pair<const_Json::Value::CZString,_Json::Value> *)&local_50,&local_60,(Value *)null);
  __pos = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,__pos._M_node,
                     (pair<const_Json::Value::CZString,_Json::Value> *)&local_50);
  ~Value(&local_40);
  CZString::~CZString((CZString *)&local_50);
LAB_001c5195:
  CZString::~CZString(&local_60);
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value&
Value::operator[] ( UInt index )
{
    JSON_ASSERT ( type_ == nullValue  ||  type_ == arrayValue );

    if ( type_ == nullValue )
        *this = Value ( arrayValue );

    CZString key ( index );
    ObjectValues::iterator it = value_.map_->lower_bound ( key );

    if ( it != value_.map_->end ()  &&  (*it).first == key )
        return (*it).second;

    ObjectValues::value_type defaultValue ( key, null );
    it = value_.map_->insert ( it, defaultValue );
    return (*it).second;
}